

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel.cpp
# Opt level: O3

int64_t primecount::pi_lmo_parallel(int64_t x,int threads,bool is_print)

{
  long lVar1;
  uint *puVar2;
  long *plVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 sum_approx [16];
  undefined1 res_00 [16];
  byte bVar9;
  uint *puVar10;
  uchar *puVar11;
  int *piVar12;
  int *piVar13;
  int64_t iVar14;
  int64_t segment_size;
  bool bVar15;
  ulong uVar16;
  int64_t iVar17;
  ulong uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  long lVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  maxint_t *pmVar24;
  long res;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  uint64_t uVar28;
  ulong uVar29;
  int iVar30;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  uint64_t uVar31;
  long lVar32;
  int64_t m;
  uint64_t uVar33;
  ulong uVar34;
  uint64_t high;
  uint64_t uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  uint64_t low;
  uint64_t uVar40;
  ulong uVar41;
  string_view_t str;
  string_view_t str_00;
  string_view_t str_01;
  string_view_t str_02;
  string_view_t str_03;
  string_view_t str_04;
  string_view_t str_05;
  undefined8 in_stack_fffffffffffff8a8;
  long in_stack_fffffffffffff8b0;
  long lVar42;
  uint64_t local_718;
  ulong local_6e8;
  type primes;
  long local_668;
  Sieve local_650;
  Vector<long,_std::allocator<long>_> phi;
  double local_5a8;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  PiTable pi;
  ThreadData local_508;
  LoadBalancerS2 loadBalancer;
  char *extraout_RDX;
  
  if (x < 2) {
    lVar26 = 0;
  }
  else {
    uVar18 = (ulong)(uint)threads;
    x_01._8_8_ = in_stack_fffffffffffff8b0;
    x_01._0_8_ = in_stack_fffffffffffff8a8;
    dVar7 = get_alpha_lmo((primecount *)x,(maxint_t)x_01);
    dVar8 = cbrt((double)x);
    uVar25 = (ulong)dVar8;
    if (0 < (long)uVar25) {
      do {
        if (uVar25 * uVar25 - (ulong)x / uVar25 == 0 ||
            (long)(uVar25 * uVar25) < (long)((ulong)x / uVar25)) goto LAB_0011bcdc;
        bVar15 = 1 < (long)uVar25;
        uVar25 = uVar25 - 1;
      } while (bVar15);
      uVar25 = 0;
    }
LAB_0011bcdc:
    lVar26 = uVar25 - 1;
    do {
      lVar1 = lVar26 + 2;
      lVar26 = lVar26 + 1;
    } while (lVar1 * lVar1 - x / lVar1 == 0 || lVar1 * lVar1 < x / lVar1);
    uVar25 = (ulong)(dVar7 * (double)lVar26);
    lVar26 = x / (long)uVar25;
    str._M_str = (char *)(x % (long)uVar25);
    local_6e8 = 8;
    if (uVar25 < 0x14) {
      local_6e8 = (ulong)(byte)(&PhiTiny::pi)[uVar25];
    }
    if (is_print) {
      str._M_len = (size_t)"";
      print((primecount *)0x0,str);
      str_00._M_str = extraout_RDX;
      str_00._M_len = (size_t)"=== pi_lmo_parallel(x) ===";
      print((primecount *)0x1a,str_00);
      str_01._M_str = extraout_RDX_00;
      str_01._M_len = (size_t)"pi(x) = S1 + S2 + pi(y) - 1 - P2";
      print((primecount *)0x20,str_01);
      x_02._8_8_ = in_stack_fffffffffffff8b0;
      x_02._0_8_ = in_stack_fffffffffffff8a8;
      print((primecount *)x,(maxint_t)x_02,0,uVar25,lVar26,(int)local_6e8);
    }
    generate_primes_u32(&primes,uVar25);
    generate_lpf(&lpf,uVar25);
    generate_moebius(&mu,uVar25);
    lVar1 = ((long)primes.end_ - (long)primes.array_ >> 2) + -1;
    uVar16 = P2(x,uVar25,lVar1,threads,is_print);
    iVar17 = S1(x,uVar25,local_6e8,threads,is_print);
    Li(x);
    if (is_print) {
      str_02._M_str = extraout_RDX_01;
      str_02._M_len = (size_t)"";
      print((primecount *)0x0,str_02);
      str_03._M_str = extraout_RDX_02;
      str_03._M_len = (size_t)"=== S2(x, y) ===";
      print((primecount *)0x10,str_03);
      str_04._M_str = extraout_RDX_03;
      str_04._M_len = (size_t)"Algorithm: POPCNT64 bit counting";
      print((primecount *)0x20,str_04);
      local_5a8 = get_time();
    }
    dVar7 = pow((double)lVar26,0.27027027027027023);
    if ((int)dVar7 < threads) {
      uVar18 = (ulong)(uint)(int)dVar7;
    }
    lVar42 = lVar26 + 0xfffff;
    lVar38 = lVar26 + 0x1ffffe;
    if (-1 < lVar42) {
      lVar38 = lVar42;
    }
    uVar27 = lVar38 >> 0x14 & 0xffffffff;
    if (uVar18 <= (ulong)(lVar38 >> 0x14)) {
      uVar27 = uVar18;
    }
    if ((int)uVar18 < 1) {
      uVar27 = 1;
    }
    if (lVar42 < 0x100000) {
      uVar27 = 1;
    }
    x_00[8] = is_print;
    x_00._0_8_ = uVar27;
    x_00._9_7_ = 0;
    sum_approx._8_8_ = in_stack_fffffffffffff8b0;
    sum_approx._0_8_ = in_stack_fffffffffffff8a8;
    LoadBalancerS2::LoadBalancerS2
              (&loadBalancer,(maxint_t)x_00,x,(maxint_t)sum_approx,0,SUB81(lVar26,0));
    PiTable::PiTable(&pi,uVar25,(int)uVar27);
    local_508.low = 0;
    local_508.segments = 0;
    local_508.segment_size = 0;
    local_508.sum._0_8_ = 0;
    local_508.sum._8_8_ = 0;
    local_508.init_secs = 0.0;
    local_508.secs = 0.0;
    dVar7 = (double)(long)uVar25;
    while (bVar15 = LoadBalancerS2::get_work(&loadBalancer,&local_508), bVar15) {
      local_508.secs = get_time();
      segment_size = local_508.segment_size;
      iVar14 = local_508.segments;
      low = local_508.low;
      uVar18 = 1;
      if (1 < local_508.low) {
        uVar18 = local_508.low;
      }
      dVar8 = SQRT(dVar7);
      if (dVar7 < 0.0) {
        dVar8 = sqrt(dVar7);
      }
      uVar27 = (ulong)dVar8;
      if (0xb504f332 < (long)uVar27) {
        uVar27 = 0xb504f333;
      }
      if ((long)uVar25 < (long)(uVar27 * uVar27)) {
        do {
          uVar27 = uVar27 - 1;
        } while (uVar27 * uVar27 - uVar25 != 0 && (long)uVar25 <= (long)(uVar27 * uVar27));
      }
      else {
        lVar42 = uVar27 * 2;
        if (lVar42 < (long)(uVar25 - uVar27 * uVar27)) {
          do {
            uVar27 = uVar27 + 1;
            lVar42 = lVar42 + 2;
          } while (lVar42 < (long)(uVar25 - uVar27 * uVar27));
        }
      }
      if (uVar27 < 6) {
        local_718 = (&BitSieve240::pi_tiny_)[uVar27];
      }
      else {
        uVar36 = uVar27 / 0xf0;
        uVar33 = pi.pi_.array_[uVar36].count;
        uVar27 = (&BitSieve240::unset_larger_)[(uint)((int)uVar27 + (int)uVar36 * -0xf0)] &
                 pi.pi_.array_[uVar36].bits;
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          local_718 = POPCOUNT(uVar27);
        }
        else {
          local_718 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline(uVar27);
        }
        local_718 = local_718 + uVar33;
      }
      uVar33 = iVar14 * segment_size + low;
      if ((long)(lVar26 + 1U) < (long)uVar33) {
        uVar33 = lVar26 + 1U;
      }
      uVar18 = (ulong)x / uVar18;
      dVar8 = (double)(long)uVar18;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      uVar27 = (ulong)dVar8;
      if (0xb504f332 < (long)uVar27) {
        uVar27 = 0xb504f333;
      }
      if ((long)uVar18 < (long)(uVar27 * uVar27)) {
        do {
          uVar27 = uVar27 - 1;
        } while (uVar27 * uVar27 - uVar18 != 0 && (long)uVar18 <= (long)(uVar27 * uVar27));
      }
      else {
        lVar42 = uVar27 * 2;
        if (lVar42 < (long)(uVar18 - uVar27 * uVar27)) {
          do {
            uVar27 = uVar27 + 1;
            lVar42 = lVar42 + 2;
          } while (lVar42 < (long)(uVar18 - uVar27 * uVar27));
        }
      }
      if ((long)(uVar25 - 1) < (long)uVar27) {
        uVar27 = uVar25 - 1;
      }
      if (uVar27 < 6) {
        uVar19 = (&BitSieve240::pi_tiny_)[uVar27];
      }
      else {
        uVar18 = uVar27 / 0xf0;
        uVar28 = pi.pi_.array_[uVar18].count;
        uVar18 = (&BitSieve240::unset_larger_)[(uint)((int)uVar27 + (int)uVar18 * -0xf0)] &
                 pi.pi_.array_[uVar18].bits;
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          uVar19 = POPCOUNT(uVar18);
        }
        else {
          uVar19 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline(uVar18);
        }
        uVar19 = uVar19 + uVar28;
      }
      uVar18 = (ulong)primes.array_[uVar19];
      if (lVar26 / (long)uVar33 < (long)(ulong)primes.array_[uVar19]) {
        uVar18 = lVar26 / (long)uVar33;
      }
      if ((uVar18 & 0xffffffff) < 6) {
        uVar28 = (&BitSieve240::pi_tiny_)[uVar18 & 0xffffffff];
      }
      else {
        iVar30 = (int)((uVar18 & 0xffffffff) / 0xf0);
        uVar27 = (ulong)(uint)(iVar30 << 4);
        lVar42 = *(long *)((long)&(pi.pi_.array_)->count + uVar27);
        uVar18 = (&BitSieve240::unset_larger_)[(uint)((int)uVar18 + iVar30 * -0xf0)] &
                 *(ulong *)((long)&(pi.pi_.array_)->bits + uVar27);
        if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
          uVar28 = POPCOUNT(uVar18);
        }
        else {
          uVar28 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline(uVar18);
        }
        uVar28 = uVar28 + lVar42;
      }
      if ((long)uVar28 <= (long)local_6e8) {
        uVar28 = local_6e8;
      }
      if ((long)uVar28 < (long)uVar19) {
        phi_vector(&phi,low,uVar19,&primes,&pi);
        Sieve::Sieve(&local_650,low,segment_size,uVar19);
        local_508.init_secs = get_time();
        local_508.init_secs = local_508.init_secs - local_508.secs;
        if ((long)low < (long)uVar33) {
          if ((long)uVar19 < (long)local_718) {
            local_718 = uVar19;
          }
          local_668 = -low;
          lVar42 = 0;
          do {
            uVar40 = low + segment_size;
            high = uVar40;
            if ((long)uVar33 < (long)uVar40) {
              high = uVar33;
            }
            uVar20 = 1;
            if (1 < (long)low) {
              uVar20 = low;
            }
            Sieve::pre_sieve<unsigned_int>(&local_650,&primes,uVar28,low,high);
            uVar22 = uVar28;
            while (piVar13 = lpf.array_, piVar12 = mu.array_, plVar3 = phi.array_,
                  puVar10 = local_650.counter_.counter.array_, uVar35 = local_650.counter_.dist,
                  puVar11 = local_650.sieve_.array_,
                  bVar9 = (anonymous_namespace)::cpu_supports_popcnt, uVar23 = uVar22 + 1,
                  (long)uVar22 < (long)local_718) {
              uVar18 = (ulong)primes.array_[uVar23];
              lVar21 = x / (long)(high * uVar18);
              lVar38 = (long)uVar25 / (long)uVar18;
              if ((long)uVar25 / (long)uVar18 < lVar21) {
                lVar38 = lVar21;
              }
              uVar27 = (ulong)x / (uVar20 * uVar18);
              if ((long)uVar25 <= (long)uVar27) {
                uVar27 = uVar25;
              }
              if ((long)uVar27 <= (long)uVar18) goto LAB_0011cb46;
              if (lVar38 < (long)uVar27) {
                do {
                  iVar30 = piVar12[uVar27];
                  if (((long)iVar30 != 0) && ((long)uVar18 < (long)piVar13[uVar27])) {
                    lVar21 = x / (long)(uVar27 * uVar18);
                    uVar29 = lVar21 - low;
                    uVar36 = local_650.prev_stop_ + 1;
                    local_650.prev_stop_ = uVar29;
                    if (uVar36 <= uVar29) {
                      if (local_650.counter_.stop <= uVar29) {
                        do {
                          local_650.counter_.stop = local_650.counter_.stop + uVar35;
                          puVar2 = puVar10 + local_650.counter_.i;
                          local_650.counter_.i = local_650.counter_.i + 1;
                          local_650.counter_.sum = local_650.counter_.sum + *puVar2;
                        } while (local_650.counter_.stop <= uVar29);
                        uVar36 = local_650.counter_.stop - uVar35;
                        local_650.count_ = local_650.counter_.sum;
                      }
                      uVar37 = uVar36 / 0xf0;
                      uVar41 = uVar29 / 0xf0;
                      uVar34 = 0xffffffffffffffff;
                      if (uVar37 == uVar41) {
                        uVar34 = *(ulong *)(Sieve::unset_larger +
                                           (ulong)(uint)((int)uVar29 + (int)uVar41 * -0xf0) * 8);
                      }
                      uVar39 = 0;
                      if (uVar37 != uVar41) {
                        uVar39 = *(ulong *)(Sieve::unset_larger +
                                           (ulong)(uint)((int)uVar29 + (int)uVar41 * -0xf0) * 8);
                      }
                      uVar29 = uVar34 & *(ulong *)(Sieve::unset_smaller +
                                                  (ulong)(uint)((int)uVar36 + (int)uVar37 * -0xf0) *
                                                  8) & *(ulong *)(puVar11 + uVar37 * 8);
                      uVar36 = *(ulong *)(puVar11 + uVar41 * 8);
                      if ((bVar9 & 1) == 0) {
                        uVar31 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline(uVar29);
                        uVar22 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline
                                           (uVar39 & uVar36);
                      }
                      else {
                        uVar31 = POPCOUNT(uVar29);
                        uVar22 = POPCOUNT(uVar39 & uVar36);
                      }
                      lVar32 = uVar31 + uVar22;
                      uVar37 = uVar37 + 1;
                      if (uVar37 < uVar41) {
                        do {
                          if ((bVar9 & 1) == 0) {
                            uVar22 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline
                                               (*(uint64_t *)(puVar11 + uVar37 * 8));
                          }
                          else {
                            uVar22 = POPCOUNT(*(uint64_t *)(puVar11 + uVar37 * 8));
                          }
                          lVar32 = lVar32 + uVar22;
                          uVar37 = uVar37 + 1;
                        } while ((ulong)(lVar21 + local_668) / 0xf0 != uVar37);
                      }
                      local_650.count_ = lVar32 + local_650.count_;
                    }
                    lVar42 = lVar42 - (local_650.count_ + plVar3[uVar23]) * (long)iVar30;
                  }
                  uVar27 = uVar27 - 1;
                } while (lVar38 < (long)uVar27);
              }
              plVar3 = plVar3 + uVar23;
              *plVar3 = *plVar3 + local_650.total_count_;
              Sieve::cross_off_count(&local_650,uVar18,uVar23);
              uVar22 = uVar23;
            }
            lVar38 = uVar22 - uVar19;
            while (uVar35 = uVar23, puVar10 = primes.array_, SBORROW8(uVar22,uVar19) != lVar38 < 0)
            {
              uVar5 = primes.array_[uVar35];
              uVar27 = (ulong)uVar5;
              uVar18 = (ulong)x / (uVar20 * uVar27);
              if ((long)uVar25 <= (long)uVar18) {
                uVar18 = uVar25;
              }
              if (uVar18 < 6) {
                lVar38 = (&BitSieve240::pi_tiny_)[uVar18];
              }
              else {
                uVar36 = uVar18 / 0xf0;
                uVar22 = pi.pi_.array_[uVar36].count;
                uVar18 = (&BitSieve240::unset_larger_)[(uint)((int)uVar18 + (int)uVar36 * -0xf0)] &
                         pi.pi_.array_[uVar36].bits;
                if ((anonymous_namespace)::cpu_supports_popcnt == 1) {
                  uVar23 = POPCOUNT(uVar18);
                }
                else {
                  uVar23 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline(uVar18);
                }
                lVar38 = uVar23 + uVar22;
              }
              plVar3 = phi.array_;
              puVar2 = local_650.counter_.counter.array_;
              uVar22 = local_650.counter_.dist;
              puVar11 = local_650.sieve_.array_;
              bVar9 = (anonymous_namespace)::cpu_supports_popcnt;
              uVar36 = x / (long)(high * uVar27);
              uVar18 = uVar27;
              if ((long)uVar27 < (long)uVar36) {
                uVar18 = uVar36;
              }
              uVar6 = puVar10[lVar38];
              uVar29 = (ulong)uVar6;
              if (uVar6 <= uVar5) break;
              if ((long)uVar36 < (long)uVar29) {
                uVar23 = local_650.prev_stop_;
                do {
                  uVar34 = (ulong)x / (uVar29 * uVar27) - low;
                  uVar36 = uVar23 + 1;
                  local_650.prev_stop_ = uVar34;
                  if (uVar36 <= uVar34) {
                    if (local_650.counter_.stop <= uVar34) {
                      do {
                        local_650.counter_.stop = local_650.counter_.stop + uVar22;
                        puVar4 = puVar2 + local_650.counter_.i;
                        local_650.counter_.i = local_650.counter_.i + 1;
                        local_650.counter_.sum = local_650.counter_.sum + *puVar4;
                      } while (local_650.counter_.stop <= uVar34);
                      uVar36 = local_650.counter_.stop - uVar22;
                      local_650.count_ = local_650.counter_.sum;
                    }
                    uVar29 = uVar36 / 0xf0;
                    uVar41 = uVar34 / 0xf0;
                    uVar37 = 0xffffffffffffffff;
                    if (uVar29 == uVar41) {
                      uVar37 = *(ulong *)(Sieve::unset_larger +
                                         (ulong)(uint)((int)uVar34 + (int)uVar41 * -0xf0) * 8);
                    }
                    uVar39 = 0;
                    if (uVar29 != uVar41) {
                      uVar39 = *(ulong *)(Sieve::unset_larger +
                                         (ulong)(uint)((int)uVar34 + (int)uVar41 * -0xf0) * 8);
                    }
                    uVar37 = uVar37 & *(ulong *)(Sieve::unset_smaller +
                                                (ulong)(uint)((int)uVar36 + (int)uVar29 * -0xf0) * 8
                                                ) & *(ulong *)(puVar11 + uVar29 * 8);
                    uVar36 = *(ulong *)(puVar11 + uVar41 * 8);
                    if ((bVar9 & 1) == 0) {
                      uVar31 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline(uVar37);
                      uVar23 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline(uVar39 & uVar36);
                    }
                    else {
                      uVar31 = POPCOUNT(uVar37);
                      uVar23 = POPCOUNT(uVar39 & uVar36);
                    }
                    lVar21 = uVar31 + uVar23;
                    while (uVar29 = uVar29 + 1, uVar29 < uVar41) {
                      if ((bVar9 & 1) == 0) {
                        uVar23 = anon_unknown.dwarf_98719::popcnt64_bitwise_noinline
                                           (*(uint64_t *)(puVar11 + uVar29 * 8));
                      }
                      else {
                        uVar23 = POPCOUNT(*(uint64_t *)(puVar11 + uVar29 * 8));
                      }
                      lVar21 = lVar21 + uVar23;
                    }
                    local_650.count_ = lVar21 + local_650.count_;
                  }
                  lVar21 = plVar3[uVar35];
                  lVar42 = lVar42 + local_650.count_ + lVar21;
                  uVar29 = (ulong)puVar10[lVar38 + -1];
                  lVar38 = lVar38 + -1;
                  uVar23 = uVar34;
                } while (uVar18 < uVar29);
              }
              else {
                lVar21 = phi.array_[uVar35];
              }
              plVar3[uVar35] = lVar21 + local_650.total_count_;
              Sieve::cross_off_count(&local_650,uVar27,uVar35);
              uVar23 = uVar35 + 1;
              uVar22 = uVar35;
              lVar38 = uVar35 - uVar19;
            }
LAB_0011cb46:
            local_668 = local_668 - segment_size;
            low = uVar40;
          } while ((long)uVar40 < (long)uVar33);
        }
        else {
          lVar42 = 0;
        }
        operator_delete(local_650.counter_.counter.array_,
                        (long)local_650.counter_.counter.capacity_ -
                        (long)local_650.counter_.counter.array_);
        operator_delete(local_650.wheel_.array_,
                        (long)local_650.wheel_.capacity_ - (long)local_650.wheel_.array_);
        operator_delete(local_650.sieve_.array_,
                        (long)local_650.sieve_.capacity_ - (long)local_650.sieve_.array_);
        operator_delete(phi.array_,(long)phi.capacity_ - (long)phi.array_);
        in_stack_fffffffffffff8b0 = lVar42;
      }
      else {
        lVar42 = 0;
      }
      local_508.sum._8_8_ = lVar42 >> 0x3f;
      local_508.sum._0_8_ = lVar42;
      dVar8 = get_time();
      local_508.secs = dVar8 - local_508.secs;
    }
    pmVar24 = LoadBalancerS2::get_sum(&loadBalancer);
    if (is_print) {
      res_00._8_8_ = in_stack_fffffffffffff8b0;
      res_00._0_8_ = in_stack_fffffffffffff8a8;
      str_05._M_str = "S2";
      str_05._M_len = 2;
      print(str_05,(maxint_t)res_00,local_5a8);
    }
    operator_delete(pi.counts_.array_,(long)pi.counts_.capacity_ - (long)pi.counts_.array_);
    operator_delete(pi.pi_.array_,(long)pi.pi_.capacity_ - (long)pi.pi_.array_);
    lVar26 = lVar1 + ~uVar16 + iVar17 + (long)pmVar24;
    operator_delete(mu.array_,(long)mu.capacity_ - (long)mu.array_);
    operator_delete(lpf.array_,(long)lpf.capacity_ - (long)lpf.array_);
    operator_delete(primes.array_,(long)primes.capacity_ - (long)primes.array_);
  }
  return lVar26;
}

Assistant:

int64_t pi_lmo_parallel(int64_t x,
                        int threads,
                        bool is_print)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  if (is_print)
  {
    print("");
    print("=== pi_lmo_parallel(x) ===");
    print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
    print(x, y, z, c, threads);
  }

  auto primes = generate_primes<uint32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads, is_print);
  int64_t s1 = S1(x, y, c, threads, is_print);
  int64_t s2_approx = S2_approx(x, pi_y, p2, s1);
  int64_t s2 = S2(x, y, z, c, s2_approx, primes, lpf, mu, threads, is_print);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}